

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O1

MacroProps *
icu_63::number::impl::NumberPropertyMapper::oldToNew
          (MacroProps *__return_storage_ptr__,DecimalFormatProperties *properties,
          DecimalFormatSymbols *symbols,DecimalFormatWarehouse *warehouse,
          DecimalFormatProperties *exportedProperties,UErrorCode *status)

{
  Precision *pPVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  CurrencyPluralInfo *pCVar5;
  FractionSignificantSettings FVar6;
  FractionSignificantSettings FVar7;
  MacroProps *pMVar8;
  UErrorCode *status_00;
  DecimalFormatProperties *pDVar9;
  int iVar10;
  uint uVar11;
  int32_t iVar12;
  PluralRules *pPVar13;
  double dVar14;
  uint uVar15;
  UErrorCode *extraout_RDX;
  UErrorCode *extraout_RDX_00;
  UErrorCode *pUVar16;
  char cVar17;
  UCurrencyUsage UVar18;
  uint uVar19;
  DecimalFormatWarehouse *pDVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  int minInt;
  int iVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  Grouper GVar27;
  Padder PVar28;
  IntegerWidth IVar29;
  Notation NVar30;
  CurrencyUnit currency;
  Precision precision;
  Locale locale;
  uint local_2c4;
  uint local_2bc;
  anon_union_8_2_136a0349_for_fUnion local_2b8;
  UNumberSignDisplay UStack_2b0;
  undefined4 uStack_2ac;
  short local_2a8;
  undefined2 uStack_2a6;
  int32_t iStack_2a4;
  char cStack_2a0;
  char cStack_29f;
  char cStack_29e;
  char cStack_29d;
  MeasureUnit *local_298;
  double local_290;
  UCurrencyUsage local_284;
  MacroProps *local_280;
  UErrorCode *local_278;
  Scale *local_270;
  ulong local_268;
  CurrencyUnit local_260;
  DecimalFormatProperties *local_240;
  Precision local_238;
  CurrencyUnit local_218;
  anon_union_8_2_136a0349_for_fUnion local_1f8;
  CurrencyUnit CStack_1f0;
  CharString local_1d0;
  UnicodeString local_190;
  UnicodeString local_150;
  Locale local_110;
  
  (__return_storage_ptr__->notation).fType = NTN_SIMPLE;
  (__return_storage_ptr__->notation).fUnion = (NotationUnion)0x0;
  local_298 = &__return_storage_ptr__->unit;
  local_278 = status;
  local_240 = exportedProperties;
  MeasureUnit::MeasureUnit(local_298);
  MeasureUnit::MeasureUnit(&__return_storage_ptr__->perUnit);
  (__return_storage_ptr__->precision).fType = RND_BOGUS;
  __return_storage_ptr__->roundingMode = UNUM_FOUND_HALFEVEN;
  (__return_storage_ptr__->grouper).fGrouping1 = -3;
  (__return_storage_ptr__->padder).fWidth = -2;
  (__return_storage_ptr__->integerWidth).fHasError = false;
  (__return_storage_ptr__->integerWidth).fUnion.minMaxInt.fMinInt = -1;
  (__return_storage_ptr__->symbols).fType = SYMPTR_NONE;
  (__return_storage_ptr__->symbols).fPtr.dfs = (DecimalFormatSymbols *)0x0;
  __return_storage_ptr__->unitWidth = UNUM_UNIT_WIDTH_COUNT;
  __return_storage_ptr__->sign = UNUM_SIGN_COUNT;
  __return_storage_ptr__->decimal = UNUM_DECIMAL_SEPARATOR_COUNT;
  local_270 = &__return_storage_ptr__->scale;
  (__return_storage_ptr__->scale).fMagnitude = 0;
  (__return_storage_ptr__->scale).fArbitrary = (DecNum *)0x0;
  (__return_storage_ptr__->scale).fError = U_ZERO_ERROR;
  __return_storage_ptr__->affixProvider = (AffixPatternProvider *)0x0;
  __return_storage_ptr__->rules = (PluralRules *)0x0;
  __return_storage_ptr__->currencySymbols = (CurrencySymbols *)0x0;
  __return_storage_ptr__->threshold = 3;
  Locale::Locale(&__return_storage_ptr__->locale);
  local_280 = __return_storage_ptr__;
  Locale::Locale(&local_110,&symbols->locale);
  SymbolsWrapper::setTo(&__return_storage_ptr__->symbols,symbols);
  status_00 = local_278;
  pCVar5 = (properties->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.
           ptr;
  pUVar16 = extraout_RDX;
  if (pCVar5 != (CurrencyPluralInfo *)0x0) {
    pPVar13 = CurrencyPluralInfo::getPluralRules(pCVar5);
    __return_storage_ptr__->rules = pPVar13;
    pUVar16 = extraout_RDX_00;
  }
  pCVar5 = (properties->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.
           ptr;
  if (pCVar5 == (CurrencyPluralInfo *)0x0) {
    (warehouse->currencyPluralInfoAPP).fBogus = true;
    PropertiesAffixPatternProvider::setTo(&warehouse->propertiesAPP,properties,pUVar16);
    pDVar20 = warehouse;
  }
  else {
    CurrencyPluralInfoAffixProvider::setTo
              (&warehouse->currencyPluralInfoAPP,pCVar5,properties,status_00);
    (warehouse->propertiesAPP).fBogus = true;
    pDVar20 = (DecimalFormatWarehouse *)&warehouse->currencyPluralInfoAPP;
  }
  __return_storage_ptr__->affixProvider = (AffixPatternProvider *)pDVar20;
  cVar17 = '\x01';
  if ((((properties->currency).fNull == true) &&
      ((properties->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr
       == (CurrencyPluralInfo *)0x0)) && ((properties->currencyUsage).fNull == true)) {
    iVar10 = (*(pDVar20->propertiesAPP).super_AffixPatternProvider._vptr_AffixPatternProvider[5])
                       (pDVar20);
    cVar17 = (char)iVar10;
  }
  resolveCurrency(&local_260,properties,&local_110,status_00);
  UVar18 = UCURR_USAGE_STANDARD;
  if ((properties->currencyUsage).fNull == false) {
    UVar18 = (properties->currencyUsage).fValue;
  }
  if (cVar17 != '\0') {
    MeasureUnit::operator=(local_298,&local_260.super_MeasureUnit);
  }
  CurrencyUnit::CurrencyUnit(&local_218,&local_260);
  CurrencySymbols::CurrencySymbols
            ((CurrencySymbols *)&local_1f8.minMaxInt,&local_218,&local_110,symbols,status_00);
  local_284 = UVar18;
  CurrencyUnit::operator=(&(warehouse->currencySymbols).fCurrency,&CStack_1f0);
  CharString::operator=(&(warehouse->currencySymbols).fLocaleName,&local_1d0);
  UnicodeString::moveFrom(&(warehouse->currencySymbols).fCurrencySymbol,&local_190);
  UnicodeString::moveFrom(&(warehouse->currencySymbols).fIntlCurrencySymbol,&local_150);
  UnicodeString::~UnicodeString(&local_150);
  UnicodeString::~UnicodeString(&local_190);
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_1d0.buffer);
  CurrencyUnit::~CurrencyUnit(&CStack_1f0);
  CurrencyUnit::~CurrencyUnit(&local_218);
  local_280->currencySymbols = &warehouse->currencySymbols;
  uVar23 = properties->maximumFractionDigits;
  uVar2 = properties->minimumFractionDigits;
  uVar3 = properties->minimumSignificantDigits;
  local_268 = (ulong)uVar3;
  uVar4 = properties->maximumSignificantDigits;
  local_298 = (MeasureUnit *)CONCAT44(local_298._4_4_,4);
  if ((properties->roundingMode).fNull == false) {
    local_298 = (MeasureUnit *)CONCAT44(local_298._4_4_,(properties->roundingMode).fValue);
  }
  iVar10 = properties->maximumIntegerDigits;
  iVar24 = properties->minimumIntegerDigits;
  dVar14 = properties->roundingIncrement;
  uVar25 = SUB84(dVar14,0);
  uVar26 = (undefined4)((ulong)dVar14 >> 0x20);
  uVar19 = uVar2;
  uVar15 = uVar23;
  if ((cVar17 != '\0') && (uVar23 == 0xffffffff || uVar2 == 0xffffffff)) {
    local_290 = dVar14;
    uVar11 = ucurr_getDefaultFractionDigitsForUsage_63
                       ((UChar *)&local_260.super_MeasureUnit.field_0x14,local_284,local_278);
    uVar25 = SUB84(local_290,0);
    uVar26 = (undefined4)((ulong)local_290 >> 0x20);
    uVar19 = uVar11;
    uVar15 = uVar11;
    if ((uVar2 & uVar23) != 0xffffffff) {
      if (uVar2 == 0xffffffff) {
        uVar15 = uVar23;
        if ((int)uVar23 <= (int)uVar11) {
          uVar19 = uVar23;
        }
      }
      else {
        uVar19 = uVar2;
        if ((int)uVar11 < (int)uVar2) {
          uVar15 = uVar2;
        }
      }
    }
  }
  pMVar8 = local_280;
  if ((iVar24 == 0) && (uVar15 != 0)) {
    local_2bc = 1;
    if (1 < (int)uVar19) {
      local_2bc = uVar19;
    }
    local_290 = (double)CONCAT44(local_290._4_4_,local_2bc);
    if ((int)local_2bc < (int)uVar15) {
      local_2bc = uVar15;
    }
    if ((int)uVar15 < 0) {
      local_2bc = 0xffffffff;
    }
    iVar24 = iVar10;
    if (999 < iVar10) {
      iVar24 = -1;
    }
    if (iVar10 < 0) {
      iVar24 = -1;
    }
    minInt = 0;
  }
  else {
    local_2bc = 0;
    if (0 < (int)uVar19) {
      local_2bc = uVar19;
    }
    local_290 = (double)CONCAT44(local_290._4_4_,local_2bc);
    if ((int)local_2bc < (int)uVar15) {
      local_2bc = uVar15;
    }
    if ((int)uVar15 < 0) {
      local_2bc = 0xffffffff;
    }
    minInt = 1;
    if (0xfffffc18 < iVar24 - 1000U) {
      minInt = iVar24;
    }
    iVar24 = -1;
    if (((-1 < iVar10) && (iVar24 = minInt, minInt <= iVar10)) && (iVar24 = -1, iVar10 < 1000)) {
      iVar24 = iVar10;
    }
  }
  local_1f8.field2 = (ulong)(uint)local_1f8._4_4_ << 0x20;
  uVar19 = (uint)local_268;
  if ((properties->currencyUsage).fNull == false) {
    Precision::constructCurrency(local_284);
    CurrencyPrecision::withCurrency
              ((Precision *)&local_2b8.minMaxInt,(CurrencyPrecision *)&local_238,&local_260);
  }
  else {
    if (((double)CONCAT44(uVar26,uVar25) == 0.0) && (!NAN((double)CONCAT44(uVar26,uVar25)))) {
      if ((uVar3 & uVar4) == 0xffffffff) {
        if ((uVar2 & uVar23) == 0xffffffff) {
          if (cVar17 != '\0') {
            Precision::constructCurrency(local_284);
            CStack_1f0.super_MeasureUnit.fTypeId._0_2_ = local_2a8;
            CStack_1f0.super_MeasureUnit.fSubTypeId = iStack_2a4;
            CStack_1f0.super_MeasureUnit.fCurrency[0] = cStack_2a0;
            CStack_1f0.super_MeasureUnit.fCurrency[1] = cStack_29f;
            CStack_1f0.super_MeasureUnit.fCurrency[2] = cStack_29e;
            CStack_1f0.super_MeasureUnit.fCurrency[3] = cStack_29d;
            local_1f8 = local_2b8;
            CStack_1f0.super_MeasureUnit.super_UObject._vptr_UObject._0_4_ = UStack_2b0;
            CStack_1f0.super_MeasureUnit.super_UObject._vptr_UObject._4_4_ = uStack_2ac;
          }
        }
        else {
          Precision::constructFraction(local_290._0_4_,local_2bc);
          CStack_1f0.super_MeasureUnit.fTypeId._0_2_ = local_2a8;
          CStack_1f0.super_MeasureUnit.fSubTypeId = iStack_2a4;
          CStack_1f0.super_MeasureUnit.fCurrency[0] = cStack_2a0;
          CStack_1f0.super_MeasureUnit.fCurrency[1] = cStack_29f;
          CStack_1f0.super_MeasureUnit.fCurrency[2] = cStack_29e;
          CStack_1f0.super_MeasureUnit.fCurrency[3] = cStack_29d;
          local_1f8 = local_2b8;
          CStack_1f0.super_MeasureUnit.super_UObject._vptr_UObject._0_4_ = UStack_2b0;
          CStack_1f0.super_MeasureUnit.super_UObject._vptr_UObject._4_4_ = uStack_2ac;
        }
        local_2c4 = 0xffffffff;
        uVar19 = 0xffffffff;
      }
      else {
        if (0x3e6 < (int)uVar19) {
          uVar19 = 999;
        }
        uVar23 = 1;
        if (1 < (int)uVar19) {
          uVar23 = uVar19;
        }
        uVar19 = uVar23;
        local_2c4 = 999;
        if (((-1 < (int)uVar4) && (local_2c4 = uVar19, (int)uVar19 <= (int)uVar4)) &&
           (local_2c4 = 999, (int)uVar4 < 999)) {
          local_2c4 = uVar4;
        }
        Precision::constructSignificant(uVar19,local_2c4);
        local_1f8 = local_2b8;
        CStack_1f0.super_MeasureUnit.fSubTypeId = iStack_2a4;
        CStack_1f0.super_MeasureUnit.fCurrency[0] = cStack_2a0;
        CStack_1f0.super_MeasureUnit.fCurrency[1] = cStack_29f;
        CStack_1f0.super_MeasureUnit.fCurrency[2] = cStack_29e;
        CStack_1f0.super_MeasureUnit.fCurrency[3] = cStack_29d;
        CStack_1f0.super_MeasureUnit.fTypeId._0_2_ = local_2a8;
        CStack_1f0.super_MeasureUnit.super_UObject._vptr_UObject._0_4_ = UStack_2b0;
        CStack_1f0.super_MeasureUnit.super_UObject._vptr_UObject._4_4_ = uStack_2ac;
      }
      goto LAB_0026196c;
    }
    Precision::constructIncrement
              ((IncrementPrecision *)&local_2b8.minMaxInt,(double)CONCAT44(uVar26,uVar25),
               local_290._0_4_);
  }
  CStack_1f0.super_MeasureUnit.fTypeId._0_2_ = local_2a8;
  CStack_1f0.super_MeasureUnit.fSubTypeId = iStack_2a4;
  CStack_1f0.super_MeasureUnit.fCurrency[0] = cStack_2a0;
  CStack_1f0.super_MeasureUnit.fCurrency[1] = cStack_29f;
  CStack_1f0.super_MeasureUnit.fCurrency[2] = cStack_29e;
  CStack_1f0.super_MeasureUnit.fCurrency[3] = cStack_29d;
  local_1f8 = local_2b8;
  CStack_1f0.super_MeasureUnit.super_UObject._vptr_UObject._0_4_ = UStack_2b0;
  CStack_1f0.super_MeasureUnit.super_UObject._vptr_UObject._4_4_ = uStack_2ac;
  local_2c4 = uVar4;
LAB_0026196c:
  pPVar1 = &pMVar8->precision;
  if (local_1f8.errorCode != U_ZERO_ERROR) {
    Precision::withMode((Precision *)&local_1f8.minMaxInt,(RoundingMode)local_298);
    CStack_1f0.super_MeasureUnit.fTypeId._0_2_ = local_2a8;
    CStack_1f0.super_MeasureUnit.fSubTypeId = iStack_2a4;
    CStack_1f0.super_MeasureUnit.fCurrency[0] = cStack_2a0;
    CStack_1f0.super_MeasureUnit.fCurrency[1] = cStack_29f;
    CStack_1f0.super_MeasureUnit.fCurrency[2] = cStack_29e;
    CStack_1f0.super_MeasureUnit.fCurrency[3] = cStack_29d;
    local_1f8 = local_2b8;
    CStack_1f0.super_MeasureUnit.super_UObject._vptr_UObject._0_4_ = UStack_2b0;
    CStack_1f0.super_MeasureUnit.super_UObject._vptr_UObject._4_4_ = uStack_2ac;
    *(ulong *)((long)&(pMVar8->precision).fUnion.increment.fIncrement + 4) =
         CONCAT26(uStack_2a6,CONCAT24(local_2a8,uStack_2ac));
    *(undefined8 *)((long)&(pMVar8->precision).fUnion + 0xc) = _iStack_2a4;
    FVar7.fMinSig = (undefined2)uStack_2ac;
    FVar7.fMaxSig = uStack_2ac._2_2_;
    FVar7.fMinFrac = (undefined2)UStack_2b0;
    FVar7.fMaxFrac = UStack_2b0._2_2_;
    *(anon_union_8_2_136a0349_for_fUnion *)pPVar1 = local_2b8;
    (pMVar8->precision).fUnion.fracSig = FVar7;
  }
  IntegerWidth::IntegerWidth
            ((IntegerWidth *)&local_2b8.minMaxInt,(digits_t)minInt,(digits_t)iVar24,
             properties->formatFailIfMoreThanMaxDigits);
  (pMVar8->integerWidth).fHasError = (bool)(undefined1)UStack_2b0;
  (pMVar8->integerWidth).fUnion = local_2b8;
  GVar27 = Grouper::forProperties(properties);
  pMVar8->grouper = GVar27;
  if (properties->formatWidth != -1) {
    PVar28 = Padder::forProperties(properties);
    pMVar8->padder = PVar28;
  }
  pMVar8->decimal = (uint)properties->decimalSeparatorAlwaysShown;
  pMVar8->sign = (uint)properties->signAlwaysShown;
  if (properties->minimumExponentDigits != -1) {
    if (iVar24 < 9) {
      if ((1 < minInt) && (minInt < iVar24)) {
        IVar29 = IntegerWidth::zeroFillTo(1);
        local_2b8 = IVar29.fUnion;
        UStack_2b0 = CONCAT31(UStack_2b0._1_3_,IVar29.fHasError);
        IVar29 = IntegerWidth::truncateAt((IntegerWidth *)&local_2b8.minMaxInt,iVar24);
        (pMVar8->integerWidth).fUnion = IVar29.fUnion;
        (pMVar8->integerWidth).fHasError = IVar29.fHasError;
        minInt = 1;
      }
    }
    else {
      IVar29 = IntegerWidth::zeroFillTo(minInt);
      local_2b8 = IVar29.fUnion;
      UStack_2b0 = CONCAT31(UStack_2b0._1_3_,IVar29.fHasError);
      IVar29 = IntegerWidth::truncateAt((IntegerWidth *)&local_2b8.minMaxInt,minInt);
      (pMVar8->integerWidth).fUnion = IVar29.fUnion;
      (pMVar8->integerWidth).fHasError = IVar29.fHasError;
      iVar24 = minInt;
    }
    iVar10 = -1;
    if (-1 < iVar24) {
      iVar10 = iVar24;
    }
    ScientificNotation::ScientificNotation
              ((ScientificNotation *)&local_2b8.minMaxInt,(int8_t)iVar10,iVar10 == minInt,
               (digits_t)properties->minimumExponentDigits,(uint)properties->exponentSignAlwaysShown
              );
    (pMVar8->notation).fUnion.scientific.fExponentSignDisplay = UStack_2b0;
    *(anon_union_8_2_136a0349_for_fUnion *)&pMVar8->notation = local_2b8;
    if (pPVar1->fType == RND_FRACTION) {
      iVar10 = properties->maximumFractionDigits;
      iVar22 = properties->minimumIntegerDigits;
      if (iVar22 == 0 && iVar10 == 0) {
        Precision::unlimited();
        Precision::withMode(&local_238,(RoundingMode)local_298);
      }
      else if (iVar22 == 0 && properties->minimumFractionDigits == 0) {
        Precision::constructSignificant(1,iVar10 + 1);
        Precision::withMode(&local_238,(RoundingMode)local_298);
      }
      else {
        iVar21 = 1;
        if (iVar22 < 1) {
          iVar21 = iVar22;
        }
        if (properties->maximumIntegerDigits <= iVar22) {
          iVar21 = iVar22;
        }
        Precision::constructSignificant(iVar21 + properties->minimumFractionDigits,iVar10 + iVar22);
        Precision::withMode(&local_238,(RoundingMode)local_298);
      }
      FVar6.fMinSig = (undefined2)uStack_2ac;
      FVar6.fMaxSig = uStack_2ac._2_2_;
      FVar6.fMinFrac = (undefined2)UStack_2b0;
      FVar6.fMaxFrac = UStack_2b0._2_2_;
      *(ulong *)((long)&(pMVar8->precision).fUnion.increment.fIncrement + 4) =
           CONCAT26(uStack_2a6,CONCAT24(local_2a8,uStack_2ac));
      *(undefined8 *)((long)&(pMVar8->precision).fUnion + 0xc) = _iStack_2a4;
      *(anon_union_8_2_136a0349_for_fUnion *)pPVar1 = local_2b8;
      (pMVar8->precision).fUnion.fracSig = FVar6;
    }
  }
  if ((properties->compactStyle).fNull == false) {
    if ((properties->compactStyle).fValue == UNUM_LONG) {
      NVar30 = Notation::compactLong();
    }
    else {
      NVar30 = Notation::compactShort();
    }
    pMVar8->notation = NVar30;
    pMVar8->affixProvider = (AffixPatternProvider *)0x0;
  }
  iVar10 = properties->multiplier;
  iVar22 = properties->multiplierScale + properties->magnitudeMultiplier;
  if (iVar10 == 1 || iVar22 == 0) {
    if (iVar22 == 0) {
      if (iVar10 == 1) {
        Scale::none();
      }
      else {
        Scale::byDouble((Scale *)&local_2b8.minMaxInt,(double)iVar10);
      }
    }
    else {
      Scale::powerOfTen(iVar22);
    }
  }
  else {
    Scale::byDoubleAndPowerOfTen((Scale *)&local_2b8.minMaxInt,(double)iVar10,iVar22);
  }
  Scale::operator=(local_270,(Scale *)&local_2b8.minMaxInt);
  Scale::~Scale((Scale *)&local_2b8.minMaxInt);
  pDVar9 = local_240;
  if (local_240 != (DecimalFormatProperties *)0x0) {
    CurrencyUnit::operator=(&(local_240->currency).fValue,&local_260);
    (pDVar9->currency).fNull = false;
    (pDVar9->roundingMode).fValue = (RoundingMode)local_298;
    (pDVar9->roundingMode).fNull = false;
    iVar12 = 0x7fffffff;
    if (iVar24 != -1) {
      iVar12 = iVar24;
    }
    pDVar9->minimumIntegerDigits = minInt;
    pDVar9->maximumIntegerDigits = iVar12;
    if (local_1f8.errorCode == U_MESSAGE_PARSE_ERROR) {
      Precision::withCurrency
                ((Precision *)&local_2b8.minMaxInt,(Precision *)&local_1f8.minMaxInt,&local_260,
                 local_278);
      dVar14 = (double)CONCAT44(uStack_2ac,UStack_2b0);
      uVar25 = local_2b8.errorCode;
    }
    else {
      dVar14 = (double)CONCAT44(CStack_1f0.super_MeasureUnit.super_UObject._vptr_UObject._4_4_,
                                (UNumberSignDisplay)
                                CStack_1f0.super_MeasureUnit.super_UObject._vptr_UObject);
      uVar25 = local_1f8.errorCode;
      local_2a8 = (short)CStack_1f0.super_MeasureUnit.fTypeId;
    }
    if (uVar25 == U_INTERNAL_PROGRAM_ERROR) {
      uVar23 = (uint)local_2a8;
      local_2bc = uVar23;
    }
    else {
      uVar23 = local_290._0_4_;
      if (uVar25 == U_INVALID_FORMAT_ERROR) {
        uVar19 = (int)((ulong)dVar14 >> 0x10) >> 0x10;
        local_2c4 = (uint)(short)((ulong)dVar14 >> 0x30);
      }
      else if (uVar25 == U_MISSING_RESOURCE_ERROR) {
        local_2bc = SUB84(dVar14,0) >> 0x10;
        uVar23 = (int)SUB82(dVar14,0);
      }
      dVar14 = 0.0;
    }
    pDVar9->minimumFractionDigits = uVar23;
    pDVar9->maximumFractionDigits = local_2bc;
    pDVar9->minimumSignificantDigits = uVar19;
    pDVar9->maximumSignificantDigits = local_2c4;
    pDVar9->roundingIncrement = dVar14;
  }
  CurrencyUnit::~CurrencyUnit(&local_260);
  Locale::~Locale(&local_110);
  return pMVar8;
}

Assistant:

MacroProps NumberPropertyMapper::oldToNew(const DecimalFormatProperties& properties,
                                          const DecimalFormatSymbols& symbols,
                                          DecimalFormatWarehouse& warehouse,
                                          DecimalFormatProperties* exportedProperties,
                                          UErrorCode& status) {
    MacroProps macros;
    Locale locale = symbols.getLocale();

    /////////////
    // SYMBOLS //
    /////////////

    macros.symbols.setTo(symbols);

    //////////////////
    // PLURAL RULES //
    //////////////////

    if (!properties.currencyPluralInfo.fPtr.isNull()) {
        macros.rules = properties.currencyPluralInfo.fPtr->getPluralRules();
    }

    /////////////
    // AFFIXES //
    /////////////

    AffixPatternProvider* affixProvider;
    if (properties.currencyPluralInfo.fPtr.isNull()) {
        warehouse.currencyPluralInfoAPP.setToBogus();
        warehouse.propertiesAPP.setTo(properties, status);
        affixProvider = &warehouse.propertiesAPP;
    } else {
        warehouse.currencyPluralInfoAPP.setTo(*properties.currencyPluralInfo.fPtr, properties, status);
        warehouse.propertiesAPP.setToBogus();
        affixProvider = &warehouse.currencyPluralInfoAPP;
    }
    macros.affixProvider = affixProvider;

    ///////////
    // UNITS //
    ///////////

    bool useCurrency = (
            !properties.currency.isNull() || !properties.currencyPluralInfo.fPtr.isNull() ||
            !properties.currencyUsage.isNull() || affixProvider->hasCurrencySign());
    CurrencyUnit currency = resolveCurrency(properties, locale, status);
    UCurrencyUsage currencyUsage = properties.currencyUsage.getOrDefault(UCURR_USAGE_STANDARD);
    if (useCurrency) {
        // NOTE: Slicing is OK.
        macros.unit = currency; // NOLINT
    }
    warehouse.currencySymbols = {currency, locale, symbols, status};
    macros.currencySymbols = &warehouse.currencySymbols;

    ///////////////////////
    // ROUNDING STRATEGY //
    ///////////////////////

    int32_t maxInt = properties.maximumIntegerDigits;
    int32_t minInt = properties.minimumIntegerDigits;
    int32_t maxFrac = properties.maximumFractionDigits;
    int32_t minFrac = properties.minimumFractionDigits;
    int32_t minSig = properties.minimumSignificantDigits;
    int32_t maxSig = properties.maximumSignificantDigits;
    double roundingIncrement = properties.roundingIncrement;
    RoundingMode roundingMode = properties.roundingMode.getOrDefault(UNUM_ROUND_HALFEVEN);
    bool explicitMinMaxFrac = minFrac != -1 || maxFrac != -1;
    bool explicitMinMaxSig = minSig != -1 || maxSig != -1;
    // Resolve min/max frac for currencies, required for the validation logic and for when minFrac or
    // maxFrac was
    // set (but not both) on a currency instance.
    // NOTE: Increments are handled in "Precision.constructCurrency()".
    if (useCurrency && (minFrac == -1 || maxFrac == -1)) {
        int32_t digits = ucurr_getDefaultFractionDigitsForUsage(
                currency.getISOCurrency(), currencyUsage, &status);
        if (minFrac == -1 && maxFrac == -1) {
            minFrac = digits;
            maxFrac = digits;
        } else if (minFrac == -1) {
            minFrac = std::min(maxFrac, digits);
        } else /* if (maxFrac == -1) */ {
            maxFrac = std::max(minFrac, digits);
        }
    }
    // Validate min/max int/frac.
    // For backwards compatibility, minimum overrides maximum if the two conflict.
    // The following logic ensures that there is always a minimum of at least one digit.
    if (minInt == 0 && maxFrac != 0) {
        // Force a digit after the decimal point.
        minFrac = minFrac <= 0 ? 1 : minFrac;
        maxFrac = maxFrac < 0 ? -1 : maxFrac < minFrac ? minFrac : maxFrac;
        minInt = 0;
        maxInt = maxInt < 0 ? -1 : maxInt > kMaxIntFracSig ? -1 : maxInt;
    } else {
        // Force a digit before the decimal point.
        minFrac = minFrac < 0 ? 0 : minFrac;
        maxFrac = maxFrac < 0 ? -1 : maxFrac < minFrac ? minFrac : maxFrac;
        minInt = minInt <= 0 ? 1 : minInt > kMaxIntFracSig ? 1 : minInt;
        maxInt = maxInt < 0 ? -1 : maxInt < minInt ? minInt : maxInt > kMaxIntFracSig ? -1 : maxInt;
    }
    Precision precision;
    if (!properties.currencyUsage.isNull()) {
        precision = Precision::constructCurrency(currencyUsage).withCurrency(currency);
    } else if (roundingIncrement != 0.0) {
        precision = Precision::constructIncrement(roundingIncrement, minFrac);
    } else if (explicitMinMaxSig) {
        minSig = minSig < 1 ? 1 : minSig > kMaxIntFracSig ? kMaxIntFracSig : minSig;
        maxSig = maxSig < 0 ? kMaxIntFracSig : maxSig < minSig ? minSig : maxSig > kMaxIntFracSig
                                                                          ? kMaxIntFracSig : maxSig;
        precision = Precision::constructSignificant(minSig, maxSig);
    } else if (explicitMinMaxFrac) {
        precision = Precision::constructFraction(minFrac, maxFrac);
    } else if (useCurrency) {
        precision = Precision::constructCurrency(currencyUsage);
    }
    if (!precision.isBogus()) {
        precision = precision.withMode(roundingMode);
        macros.precision = precision;
    }

    ///////////////////
    // INTEGER WIDTH //
    ///////////////////

    macros.integerWidth = IntegerWidth(
            static_cast<digits_t>(minInt),
            static_cast<digits_t>(maxInt),
            properties.formatFailIfMoreThanMaxDigits);

    ///////////////////////
    // GROUPING STRATEGY //
    ///////////////////////

    macros.grouper = Grouper::forProperties(properties);

    /////////////
    // PADDING //
    /////////////

    if (properties.formatWidth != -1) {
        macros.padder = Padder::forProperties(properties);
    }

    ///////////////////////////////
    // DECIMAL MARK ALWAYS SHOWN //
    ///////////////////////////////

    macros.decimal = properties.decimalSeparatorAlwaysShown ? UNUM_DECIMAL_SEPARATOR_ALWAYS
                                                            : UNUM_DECIMAL_SEPARATOR_AUTO;

    ///////////////////////
    // SIGN ALWAYS SHOWN //
    ///////////////////////

    macros.sign = properties.signAlwaysShown ? UNUM_SIGN_ALWAYS : UNUM_SIGN_AUTO;

    /////////////////////////
    // SCIENTIFIC NOTATION //
    /////////////////////////

    if (properties.minimumExponentDigits != -1) {
        // Scientific notation is required.
        // This whole section feels like a hack, but it is needed for regression tests.
        // The mapping from property bag to scientific notation is nontrivial due to LDML rules.
        if (maxInt > 8) {
            // But #13110: The maximum of 8 digits has unknown origins and is not in the spec.
            // If maxInt is greater than 8, it is set to minInt, even if minInt is greater than 8.
            maxInt = minInt;
            macros.integerWidth = IntegerWidth::zeroFillTo(minInt).truncateAt(maxInt);
        } else if (maxInt > minInt && minInt > 1) {
            // Bug #13289: if maxInt > minInt > 1, then minInt should be 1.
            minInt = 1;
            macros.integerWidth = IntegerWidth::zeroFillTo(minInt).truncateAt(maxInt);
        }
        int engineering = maxInt < 0 ? -1 : maxInt;
        macros.notation = ScientificNotation(
                // Engineering interval:
                static_cast<int8_t>(engineering),
                // Enforce minimum integer digits (for patterns like "000.00E0"):
                (engineering == minInt),
                // Minimum exponent digits:
                static_cast<digits_t>(properties.minimumExponentDigits),
                // Exponent sign always shown:
                properties.exponentSignAlwaysShown ? UNUM_SIGN_ALWAYS : UNUM_SIGN_AUTO);
        // Scientific notation also involves overriding the rounding mode.
        // TODO: Overriding here is a bit of a hack. Should this logic go earlier?
        if (macros.precision.fType == Precision::PrecisionType::RND_FRACTION) {
            // For the purposes of rounding, get the original min/max int/frac, since the local
            // variables have been manipulated for display purposes.
            int maxInt_ = properties.maximumIntegerDigits;
            int minInt_ = properties.minimumIntegerDigits;
            int minFrac_ = properties.minimumFractionDigits;
            int maxFrac_ = properties.maximumFractionDigits;
            if (minInt_ == 0 && maxFrac_ == 0) {
                // Patterns like "#E0" and "##E0", which mean no rounding!
                macros.precision = Precision::unlimited().withMode(roundingMode);
            } else if (minInt_ == 0 && minFrac_ == 0) {
                // Patterns like "#.##E0" (no zeros in the mantissa), which mean round to maxFrac+1
                macros.precision = Precision::constructSignificant(1, maxFrac_ + 1).withMode(roundingMode);
            } else {
                int maxSig_ = minInt_ + maxFrac_;
                // Bug #20058: if maxInt_ > minInt_ > 1, then minInt_ should be 1.
                if (maxInt_ > minInt_ && minInt_ > 1) {
                    minInt_ = 1;
                }
                int minSig_ = minInt_ + minFrac_;
                // To avoid regression, maxSig is not reset when minInt_ set to 1.
                // TODO: Reset maxSig_ = 1 + minFrac_ to follow the spec.
                macros.precision = Precision::constructSignificant(minSig_, maxSig_).withMode(roundingMode);
            }
        }
    }

    //////////////////////
    // COMPACT NOTATION //
    //////////////////////

    if (!properties.compactStyle.isNull()) {
        if (properties.compactStyle.getNoError() == UNumberCompactStyle::UNUM_LONG) {
            macros.notation = Notation::compactLong();
        } else {
            macros.notation = Notation::compactShort();
        }
        // Do not forward the affix provider.
        macros.affixProvider = nullptr;
    }

    /////////////////
    // MULTIPLIERS //
    /////////////////

    macros.scale = scaleFromProperties(properties);

    //////////////////////
    // PROPERTY EXPORTS //
    //////////////////////

    if (exportedProperties != nullptr) {

        exportedProperties->currency = currency;
        exportedProperties->roundingMode = roundingMode;
        exportedProperties->minimumIntegerDigits = minInt;
        exportedProperties->maximumIntegerDigits = maxInt == -1 ? INT32_MAX : maxInt;

        Precision rounding_;
        if (precision.fType == Precision::PrecisionType::RND_CURRENCY) {
            rounding_ = precision.withCurrency(currency, status);
        } else {
            rounding_ = precision;
        }
        int minFrac_ = minFrac;
        int maxFrac_ = maxFrac;
        int minSig_ = minSig;
        int maxSig_ = maxSig;
        double increment_ = 0.0;
        if (rounding_.fType == Precision::PrecisionType::RND_FRACTION) {
            minFrac_ = rounding_.fUnion.fracSig.fMinFrac;
            maxFrac_ = rounding_.fUnion.fracSig.fMaxFrac;
        } else if (rounding_.fType == Precision::PrecisionType::RND_INCREMENT) {
            increment_ = rounding_.fUnion.increment.fIncrement;
            minFrac_ = rounding_.fUnion.increment.fMinFrac;
            maxFrac_ = rounding_.fUnion.increment.fMinFrac;
        } else if (rounding_.fType == Precision::PrecisionType::RND_SIGNIFICANT) {
            minSig_ = rounding_.fUnion.fracSig.fMinSig;
            maxSig_ = rounding_.fUnion.fracSig.fMaxSig;
        }

        exportedProperties->minimumFractionDigits = minFrac_;
        exportedProperties->maximumFractionDigits = maxFrac_;
        exportedProperties->minimumSignificantDigits = minSig_;
        exportedProperties->maximumSignificantDigits = maxSig_;
        exportedProperties->roundingIncrement = increment_;
    }

    return macros;
}